

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O1

int tnt_request_writeout(tnt_stream *s,tnt_request *req,uint64_t *sync)

{
  byte *pbVar1;
  tnt_request_t tVar2;
  tnt_iterator_t tVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ssize_t sVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  byte bVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  undefined1 uStack_148;
  undefined1 auStack_147 [7];
  char header [128];
  iovec v [10];
  
  tVar2 = (req->hdr).type;
  if (((sync != (uint64_t *)0x0) && (*sync == 0x7fffffffffffffff)) &&
     ((~s->reqid & 0x7fffffffffffffff) == 0)) {
    s->reqid = 0;
  }
  uVar8 = s->reqid;
  s->reqid = uVar8 + 1;
  (req->hdr).sync = uVar8;
  header._120_8_ = header + 1;
  v[0].iov_base = (void *)0x0;
  header[1] = -0x7e;
  header[2] = '\0';
  if (tVar2 < 0x80) {
    pcVar7 = header + 4;
LAB_00116aa4:
    pcVar7[-1] = (char)tVar2;
  }
  else {
    if (tVar2 < 0x100) {
      pcVar7 = header + 5;
      header[3] = -0x34;
      goto LAB_00116aa4;
    }
    if (tVar2 < 0x10000) {
      pcVar7 = header + 6;
      header[3] = -0x33;
      uVar12 = (ushort)tVar2 << 8 | (ushort)tVar2 >> 8;
      header[4] = (char)uVar12;
      header[5] = (char)(uVar12 >> 8);
    }
    else {
      pcVar7 = header + 8;
      header[3] = -0x32;
      header._4_4_ = tVar2 >> 0x18 | (tVar2 & 0xff0000) >> 8 | (tVar2 & 0xff00) << 8 | tVar2 << 0x18
      ;
    }
  }
  *pcVar7 = '\x01';
  if (uVar8 < 0x80) {
    pcVar7[1] = (char)uVar8;
    lVar11 = 2;
  }
  else if (uVar8 < 0x100) {
    pcVar7[1] = -0x34;
    pcVar7[2] = (char)uVar8;
    lVar11 = 3;
  }
  else if (uVar8 < 0x10000) {
    pcVar7[1] = -0x33;
    *(ushort *)(pcVar7 + 2) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
    lVar11 = 4;
  }
  else if (uVar8 >> 0x20 == 0) {
    pcVar7[1] = -0x32;
    uVar10 = (uint)uVar8;
    *(uint *)(pcVar7 + 2) =
         uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    lVar11 = 6;
  }
  else {
    pcVar7[1] = -0x31;
    *(ulong *)(pcVar7 + 2) =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    lVar11 = 10;
  }
  pbVar1 = (byte *)(pcVar7 + lVar11);
  if ((tVar2 < TNT_OP_CALL_16) || (tVar2 == TNT_OP_UPSERT)) {
    pbVar1[1] = 0x10;
    uVar10 = req->space_id;
    if (uVar10 < 0x80) {
      pbVar1[2] = (byte)uVar10;
      pbVar14 = pbVar1 + 3;
    }
    else if (uVar10 < 0x100) {
      pbVar1[2] = 0xcc;
      pbVar1[3] = (byte)uVar10;
      pbVar14 = pbVar1 + 4;
    }
    else if (uVar10 < 0x10000) {
      pbVar1[2] = 0xcd;
      *(ushort *)(pbVar1 + 3) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
      pbVar14 = pbVar1 + 5;
    }
    else {
      pbVar1[2] = 0xce;
      *(uint *)(pbVar1 + 3) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      pbVar14 = pbVar1 + 7;
    }
    bVar13 = 1;
  }
  else {
    pbVar14 = (byte *)(pcVar7 + lVar11 + 1);
    bVar13 = 0;
  }
  uVar10 = req->index_id;
  if (((uVar10 != 0) && (tVar2 < TNT_OP_CALL_16)) && ((0x32U >> (tVar2 & 0x1f) & 1) != 0)) {
    *pbVar14 = 0x11;
    if (uVar10 < 0x80) {
      pbVar14[1] = (byte)uVar10;
      lVar11 = 2;
    }
    else if (uVar10 < 0x100) {
      pbVar14[1] = 0xcc;
      pbVar14[2] = (byte)uVar10;
      lVar11 = 3;
    }
    else if (uVar10 < 0x10000) {
      pbVar14[1] = 0xcd;
      *(ushort *)(pbVar14 + 2) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
      lVar11 = 4;
    }
    else {
      pbVar14[1] = 0xce;
      *(uint *)(pbVar14 + 2) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      lVar11 = 6;
    }
    pbVar14 = pbVar14 + lVar11;
    bVar13 = bVar13 + 1;
  }
  if (tVar2 == TNT_OP_SELECT) {
    *pbVar14 = 0x12;
    uVar10 = req->limit;
    if (uVar10 < 0x80) {
      pbVar14[1] = (byte)uVar10;
      lVar11 = 2;
    }
    else if (uVar10 < 0x100) {
      pbVar14[1] = 0xcc;
      pbVar14[2] = (byte)uVar10;
      lVar11 = 3;
    }
    else if (uVar10 < 0x10000) {
      pbVar14[1] = 0xcd;
      *(ushort *)(pbVar14 + 2) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
      lVar11 = 4;
    }
    else {
      pbVar14[1] = 0xce;
      *(uint *)(pbVar14 + 2) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      lVar11 = 6;
    }
    pbVar14 = pbVar14 + lVar11;
    bVar13 = bVar13 + 1;
  }
  uVar10 = req->offset;
  if (uVar10 != 0 && tVar2 == TNT_OP_SELECT) {
    *pbVar14 = 0x13;
    if (uVar10 < 0x80) {
      pbVar14[1] = (byte)uVar10;
      lVar11 = 2;
    }
    else if (uVar10 < 0x100) {
      pbVar14[1] = 0xcc;
      pbVar14[2] = (byte)uVar10;
      lVar11 = 3;
    }
    else if (uVar10 < 0x10000) {
      pbVar14[1] = 0xcd;
      *(ushort *)(pbVar14 + 2) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
      lVar11 = 4;
    }
    else {
      pbVar14[1] = 0xce;
      *(uint *)(pbVar14 + 2) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      lVar11 = 6;
    }
    pbVar14 = pbVar14 + lVar11;
    bVar13 = bVar13 + 1;
  }
  tVar3 = req->iterator;
  if (tVar3 != TNT_ITER_EQ && tVar2 == TNT_OP_SELECT) {
    *pbVar14 = 0x14;
    if (tVar3 < 0x80) {
      pbVar14[1] = (byte)tVar3;
      lVar11 = 2;
    }
    else if (tVar3 < 0x100) {
      pbVar14[1] = 0xcc;
      pbVar14[2] = (byte)tVar3;
      lVar11 = 3;
    }
    else if (tVar3 < 0x10000) {
      pbVar14[1] = 0xcd;
      *(ushort *)(pbVar14 + 2) = (ushort)tVar3 << 8 | (ushort)tVar3 >> 8;
      lVar11 = 4;
    }
    else {
      pbVar14[1] = 0xce;
      *(tnt_iterator_t *)(pbVar14 + 2) =
           tVar3 >> 0x18 | (tVar3 & 0xff0000) >> 8 | (tVar3 & 0xff00) << 8 | tVar3 << 0x18;
      lVar11 = 6;
    }
    pbVar14 = pbVar14 + lVar11;
    bVar13 = bVar13 + 1;
  }
  pcVar7 = req->key;
  if (pcVar7 == (char *)0x0) {
    uVar10 = 1;
    pbVar15 = (byte *)header._120_8_;
    goto LAB_00116e47;
  }
  iVar6 = -1;
  switch(tVar2) {
  case TNT_OP_SELECT:
  case TNT_OP_UPDATE:
  case TNT_OP_DELETE:
    *pbVar14 = 0x20;
    break;
  default:
    goto switchD_00116db9_caseD_2;
  case TNT_OP_CALL_16:
  case TNT_OP_CALL:
    *pbVar14 = 0x22;
    goto LAB_00116dd3;
  case TNT_OP_EVAL:
    *pbVar14 = 0x27;
LAB_00116dd3:
    lVar11 = (long)req->key_end - (long)pcVar7;
    uVar10 = (uint)lVar11;
    if (uVar10 < 0x20) {
      pbVar14[1] = (byte)lVar11 | 0xa0;
      lVar11 = 2;
    }
    else if (uVar10 < 0x100) {
      pbVar14[1] = 0xd9;
      pbVar14[2] = (byte)lVar11;
      lVar11 = 3;
    }
    else if (uVar10 < 0x10000) {
      pbVar14[1] = 0xda;
      *(ushort *)(pbVar14 + 2) = (ushort)lVar11 << 8 | (ushort)lVar11 >> 8;
      lVar11 = 4;
    }
    else {
      pbVar14[1] = 0xdb;
      *(uint *)(pbVar14 + 2) =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      lVar11 = 6;
    }
    goto LAB_00116e10;
  case TNT_OP_UPSERT:
    *pbVar14 = 0x28;
  }
  lVar11 = 1;
LAB_00116e10:
  pbVar15 = pbVar14 + lVar11;
  v[1].iov_base = pbVar15 + -header._120_8_;
  v[1].iov_len = (size_t)pcVar7;
  v[2].iov_base = req->key_end + -(long)pcVar7;
  bVar13 = bVar13 + 1;
  uVar10 = 3;
  pbVar14 = pbVar15;
  v[0].iov_len = header._120_8_;
LAB_00116e47:
  pcVar7 = req->tuple;
  pbVar16 = pbVar15;
  if (pcVar7 != (char *)0x0) {
    *pbVar14 = 0x21;
    pbVar16 = pbVar14 + 1;
    uVar8 = (ulong)(uVar10 << 4);
    *(byte **)(header + uVar8 + 0x78) = pbVar15;
    *(long *)((long)&v[0].iov_base + uVar8) = (long)pbVar16 - (long)pbVar15;
    *(char **)((long)&v[0].iov_len + uVar8) = pcVar7;
    uVar10 = uVar10 + 2;
    *(long *)((long)&v[1].iov_base + uVar8) = (long)req->tuple_end - (long)pcVar7;
    bVar13 = bVar13 + 1;
    pbVar14 = pbVar16;
  }
  uVar5 = req->index_base;
  uVar8 = (ulong)(int)uVar5;
  if ((uVar8 != 0) && ((tVar2 == TNT_OP_UPSERT || (tVar2 == TNT_OP_UPDATE)))) {
    *pbVar14 = 0x15;
    if (uVar5 < 0x80) {
      pbVar14[1] = (byte)uVar5;
      lVar11 = 2;
    }
    else if (uVar5 < 0x100) {
      pbVar14[1] = 0xcc;
      pbVar14[2] = (byte)uVar5;
      lVar11 = 3;
    }
    else if (uVar5 < 0x10000) {
      pbVar14[1] = 0xcd;
      *(ushort *)(pbVar14 + 2) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
      lVar11 = 4;
    }
    else if ((int)uVar5 < 0) {
      pbVar14[1] = 0xcf;
      *(ulong *)(pbVar14 + 2) =
           uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
           (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
           (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
      lVar11 = 10;
    }
    else {
      pbVar14[1] = 0xce;
      *(uint *)(pbVar14 + 2) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      lVar11 = 6;
    }
    pbVar14 = pbVar14 + lVar11;
    bVar13 = bVar13 + 1;
  }
  if ((bVar13 & 0xf0) != 0) {
    __assert_fail("mp_sizeof_map(nd) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_request.c"
                  ,0x135,
                  "int tnt_request_writeout(struct tnt_stream *, struct tnt_request *, uint64_t *)")
    ;
  }
  if ((long)pbVar14 - (long)pbVar16 != 0) {
    uVar5 = uVar10 << 4;
    *(byte **)(header + (ulong)uVar5 + 0x78) = pbVar16;
    uVar10 = uVar10 + 1;
    *(long *)((long)&v[0].iov_base + (ulong)uVar5) = (long)pbVar14 - (long)pbVar16;
  }
  *pbVar1 = bVar13 | 0x80;
  if (uVar10 < 2) {
    uVar8 = 0;
  }
  else {
    lVar11 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + *(long *)((long)&v[1].iov_base + lVar11);
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uVar10 << 4) - 0x10 != lVar11);
  }
  bVar4 = uVar8 >> 0x20 == 0;
  lVar11 = (ulong)bVar4 * 4;
  header._120_8_ = &uStack_148 + lVar11;
  v[0].iov_base = (void *)((ulong)!bVar4 * 4 + 5);
  if (bVar4) {
    *(undefined1 *)header._120_8_ = 0xce;
    uVar5 = (uint)uVar8;
    *(uint *)(auStack_147 + lVar11) =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  else {
    *(undefined1 *)header._120_8_ = 0xcf;
    *(ulong *)(auStack_147 + lVar11) =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  }
  sVar9 = (*s->writev)(s,(iovec *)(header + 0x78),uVar10);
  iVar6 = -(uint)(sVar9 == -1);
  if ((sync != (uint64_t *)0x0) && (sVar9 != -1)) {
    *sync = (req->hdr).sync;
    iVar6 = 0;
  }
switchD_00116db9_caseD_2:
  return iVar6;
}

Assistant:

int
tnt_request_writeout(struct tnt_stream *s, struct tnt_request *req,
		     uint64_t *sync) {
	enum tnt_request_t tp = req->hdr.type;
	if (sync != NULL && *sync == INT64_MAX &&
	    (s->reqid & INT64_MAX) == INT64_MAX) {
		s->reqid = 0;
	}
	req->hdr.sync = s->reqid++;
	/* header */
	/* int (9) + 1 + sync + 1 + op */
	struct iovec v[10]; int v_sz = 0;
	char header[128];
	char *pos = header + 9;
	char *begin = pos;
	v[v_sz].iov_base = begin;
	v[v_sz++].iov_len  = 0;
	pos = mp_encode_map(pos, 2);              /* 1 */
	pos = mp_encode_uint(pos, TNT_CODE);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.type); /* 1 */
	pos = mp_encode_uint(pos, TNT_SYNC);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.sync); /* 9 */
	char *map = pos++;                        /* 1 */
	size_t nd = 0;
	if (tp < TNT_OP_CALL_16 || tp == TNT_OP_UPSERT) {
		pos = mp_encode_uint(pos, TNT_SPACE);     /* 1 */
		pos = mp_encode_uint(pos, req->space_id); /* 5 */
		nd += 1;
	}
	if (req->index_id && (tp == TNT_OP_SELECT ||
			      tp == TNT_OP_UPDATE ||
			      tp == TNT_OP_DELETE)) {
		pos = mp_encode_uint(pos, TNT_INDEX);     /* 1 */
		pos = mp_encode_uint(pos, req->index_id); /* 5 */
		nd += 1;
	}
	if (tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_LIMIT);  /* 1 */
		pos = mp_encode_uint(pos, req->limit); /* 5 */
		nd += 1;
	}
	if (req->offset && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_OFFSET);  /* 1 */
		pos = mp_encode_uint(pos, req->offset); /* 5 */
		nd += 1;
	}
	if (req->iterator && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_ITERATOR);  /* 1 */
		pos = mp_encode_uint(pos, req->iterator); /* 1 */
		nd += 1;
	}
	if (req->key) {
		switch (tp) {
		case TNT_OP_EVAL:
			pos = mp_encode_uint(pos, TNT_EXPRESSION);          /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_CALL_16:
		case TNT_OP_CALL:
			pos = mp_encode_uint(pos, TNT_FUNCTION);            /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_SELECT:
		case TNT_OP_UPDATE:
		case TNT_OP_DELETE:
			pos = mp_encode_uint(pos, TNT_KEY); /* 1 */
			break;
		case TNT_OP_UPSERT:
			pos = mp_encode_uint(pos, TNT_OPS); /* 1 */
			break;
		default:
			return -1;
		}
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->key;
		v[v_sz++].iov_len = req->key_end - req->key;
		nd += 1;
	}
	if (req->tuple) {
		pos = mp_encode_uint(pos, TNT_TUPLE); /* 1 */
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->tuple;
		v[v_sz++].iov_len = req->tuple_end - req->tuple;
		nd += 1;
	}
	if (req->index_base && (tp == TNT_OP_UPDATE || tp == TNT_OP_UPSERT)) {
		pos = mp_encode_uint(pos, TNT_INDEX_BASE);  /* 1 */
		pos = mp_encode_uint(pos, req->index_base); /* 1 */
		nd += 1;
	}
	assert(mp_sizeof_map(nd) == 1);
	if (pos != begin) {
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
	}
	mp_encode_map(map, nd);

	size_t plen = 0;
	for (int i = 1; i < v_sz; ++i) plen += v[i].iov_len;
	size_t hlen = mp_sizeof_luint32(plen);
	v[0].iov_base -= hlen;
	v[0].iov_len  += hlen;
	mp_encode_luint32(v[0].iov_base, plen);
	ssize_t rv = s->writev(s, v, v_sz);
	if (rv == -1)
		return -1;
	if (sync != NULL)
		*sync = req->hdr.sync;
	return 0;
}